

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsaes_oaep_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,uchar *label,size_t label_len,size_t *olen,uchar *input,uchar *output,
              size_t output_max_len)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uchar *__src;
  int local_4e4;
  undefined1 local_4e0 [8];
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  byte local_4b8 [4];
  uint hlen;
  uchar lhash [64];
  uchar buf [1024];
  byte local_6a;
  byte local_69;
  uchar pad_done;
  byte *pbStack_68;
  uchar bad;
  uchar *p;
  size_t pad_len;
  size_t i;
  size_t ilen;
  int ret;
  size_t label_len_local;
  uchar *label_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if ((mode == 1) && (ctx->padding != 1)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    uVar1 = ctx->len;
    if ((uVar1 < 0x10) || (0x400 < uVar1)) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      md_ctx.hmac_ctx = mbedtls_md_info_from_type(ctx->hash_id);
      if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
        ctx_local._4_4_ = -0x4080;
      }
      else {
        bVar2 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
        uVar3 = (uint)bVar2;
        if (uVar1 < uVar3 * 2 + 2) {
          ctx_local._4_4_ = -0x4080;
        }
        else {
          if (mode == 0) {
            local_4e4 = mbedtls_rsa_public(ctx,input,lhash + 0x38);
          }
          else {
            local_4e4 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,lhash + 0x38);
          }
          if (local_4e4 == 0) {
            mbedtls_md_init((mbedtls_md_context_t *)local_4e0);
            ctx_local._4_4_ =
                 mbedtls_md_setup((mbedtls_md_context_t *)local_4e0,
                                  (mbedtls_md_info_t *)md_ctx.hmac_ctx,0);
            if (ctx_local._4_4_ == 0) {
              mbedtls_md((mbedtls_md_info_t *)md_ctx.hmac_ctx,label,label_len,local_4b8);
              mgf_mask(lhash + 0x39,(ulong)uVar3,lhash + (ulong)uVar3 + 0x39,(uVar1 - uVar3) - 1,
                       (mbedtls_md_context_t *)local_4e0);
              mgf_mask(lhash + (ulong)uVar3 + 0x39,(uVar1 - uVar3) - 1,lhash + 0x39,(ulong)uVar3,
                       (mbedtls_md_context_t *)local_4e0);
              mbedtls_md_free((mbedtls_md_context_t *)local_4e0);
              local_69 = lhash[0x38];
              pbStack_68 = lhash + (ulong)uVar3 + 0x39;
              for (pad_len = 0; pad_len < uVar3; pad_len = pad_len + 1) {
                local_69 = local_69 | local_4b8[pad_len] ^ *pbStack_68;
                pbStack_68 = pbStack_68 + 1;
              }
              p = (uchar *)0x0;
              local_6a = 0;
              for (pad_len = 0; pad_len < (uVar1 + (ulong)bVar2 * -2) - 2; pad_len = pad_len + 1) {
                local_6a = local_6a | pbStack_68[pad_len];
                p = p + (int)((int)((uint)local_6a | -(uint)local_6a & 0xff) >> 7 ^ 1);
              }
              __src = p + (long)pbStack_68 + 1;
              if (local_69 == 0 && p[(long)pbStack_68] == '\x01') {
                if (output_max_len < uVar1 - ((long)__src - (long)(lhash + 0x38))) {
                  ctx_local._4_4_ = -0x4400;
                }
                else {
                  *olen = uVar1 - ((long)__src - (long)(lhash + 0x38));
                  memcpy(output,__src,*olen);
                  ctx_local._4_4_ = 0;
                }
              }
              else {
                ctx_local._4_4_ = -0x4100;
              }
            }
            else {
              mbedtls_md_free((mbedtls_md_context_t *)local_4e0);
            }
          }
          else {
            ctx_local._4_4_ = local_4e4;
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsaes_oaep_decrypt( mbedtls_rsa_context *ctx,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng,
                            int mode,
                            const unsigned char *label, size_t label_len,
                            size_t *olen,
                            const unsigned char *input,
                            unsigned char *output,
                            size_t output_max_len )
{
    int ret;
    size_t ilen, i, pad_len;
    unsigned char *p, bad, pad_done;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    unsigned char lhash[MBEDTLS_MD_MAX_SIZE];
    unsigned int hlen;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    /*
     * Parameters sanity checks
     */
    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ilen = ctx->len;

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    // checking for integer underflow
    if( 2 * hlen + 2 > ilen )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /*
     * RSA operation
     */
    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        return( ret );

    /*
     * Unmask data and generate lHash
     */
    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
    {
        mbedtls_md_free( &md_ctx );
        return( ret );
    }


    /* Generate lHash */
    mbedtls_md( md_info, label, label_len, lhash );

    /* seed: Apply seedMask to maskedSeed */
    mgf_mask( buf + 1, hlen, buf + hlen + 1, ilen - hlen - 1,
               &md_ctx );

    /* DB: Apply dbMask to maskedDB */
    mgf_mask( buf + hlen + 1, ilen - hlen - 1, buf + 1, hlen,
               &md_ctx );

    mbedtls_md_free( &md_ctx );

    /*
     * Check contents, in "constant-time"
     */
    p = buf;
    bad = 0;

    bad |= *p++; /* First byte must be 0 */

    p += hlen; /* Skip seed */

    /* Check lHash */
    for( i = 0; i < hlen; i++ )
        bad |= lhash[i] ^ *p++;

    /* Get zero-padding len, but always read till end of buffer
     * (minus one, for the 01 byte) */
    pad_len = 0;
    pad_done = 0;
    for( i = 0; i < ilen - 2 * hlen - 2; i++ )
    {
        pad_done |= p[i];
        pad_len += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
    }

    p += pad_len;
    bad |= *p++ ^ 0x01;

    /*
     * The only information "leaked" is whether the padding was correct or not
     * (eg, no data is copied if it was not correct). This meets the
     * recommendations in PKCS#1 v2.2: an opponent cannot distinguish between
     * the different error conditions.
     */
    if( bad != 0 )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( ilen - ( p - buf ) > output_max_len )
        return( MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE );

    *olen = ilen - (p - buf);
    memcpy( output, p, *olen );

    return( 0 );
}